

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::createConnection
          (PortConnectionBuilder *this,InterfacePortSymbol *port,IfaceConn ifaceConn,
          Expression *expr,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes)

{
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes_00;
  bool bVar1;
  Compilation *this_00;
  __extent_storage<18446744073709551615UL> in_RSI;
  pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *in_RDI;
  pointer in_R8;
  PortConnection *conn;
  Expression **in_stack_ffffffffffffffa8;
  InterfacePortSymbol *args;
  BumpAllocator *in_stack_ffffffffffffffc0;
  
  args = (InterfacePortSymbol *)&stack0x00000008;
  this_00 = (Compilation *)
            BumpAllocator::
            emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&,std::pair<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>&,slang::ast::Expression_const*&>
                      (in_stack_ffffffffffffffc0,args,in_RDI,in_stack_ffffffffffffffa8);
  bVar1 = std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                     0x7b5898);
  if (!bVar1) {
    attributes_00._M_extent._M_extent_value = in_RSI._M_extent_value;
    attributes_00._M_ptr = in_R8;
    Compilation::setAttributes
              (this_00,(PortConnection *)(args->super_Symbol).name._M_len,attributes_00);
  }
  return (PortConnection *)this_00;
}

Assistant:

PortConnection* createConnection(const InterfacePortSymbol& port,
                                     PortConnection::IfaceConn ifaceConn, const Expression* expr,
                                     std::span<const AttributeSymbol* const> attributes) {
        auto conn = comp.emplace<PortConnection>(port, ifaceConn, expr);
        if (!attributes.empty())
            comp.setAttributes(*conn, attributes);

        return conn;
    }